

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minefield.cpp
# Opt level: O3

bool __thiscall Minefield::isGameLost(Minefield *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  iVar3 = this->given_x_dimension;
  if (((this->opened_mine != false) ||
      (this->given_y_dimension * iVar3 - this->open_cnt <= this->given_mine_count)) && (0 < iVar3))
  {
    iVar2 = this->given_y_dimension;
    lVar4 = 0;
    do {
      if (0 < iVar2) {
        uVar6 = 0;
        do {
          if ((*(ulong *)(*(long *)&(this->mines).
                                    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar4].
                                    super__Bvector_base<std::allocator<bool>_>._M_impl +
                         (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0) {
            bVar1 = isOpen(this,(int)lVar4,(int)uVar6);
            if (bVar1) {
              return true;
            }
            iVar2 = this->given_y_dimension;
          }
          uVar5 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar5;
        } while ((int)uVar5 < iVar2);
        iVar3 = this->given_x_dimension;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  return false;
}

Assistant:

bool Minefield::isGameLost() {
    if (! isGameEnded()) {
        return false;
    }

    // there is a field w/ a mine that has been opened
    for (int x = 0; x < getXDimension(); x++) {
        for (int y = 0; y < getYDimension(); y++) {
            if (mines[x][y] && isOpen(x, y)) {
                return true;
            }
        }
    }
    return false;
}